

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O3

void __thiscall FShaderProgram::~FShaderProgram(FShaderProgram *this)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  if (this->mProgram != 0) {
    (*_ptrc_glDeleteProgram)(this->mProgram);
  }
  lVar2 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (this->mShaders[lVar2] != 0) {
      (*_ptrc_glDeleteShader)(this->mShaders[lVar2]);
    }
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

FShaderProgram::~FShaderProgram()
{
	if (mProgram != 0)
		glDeleteProgram(mProgram);

	for (int i = 0; i < NumShaderTypes; i++)
	{
		if (mShaders[i] != 0)
			glDeleteShader(mShaders[i]);
	}
}